

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

int exr_set_screen_window_center(exr_context_t ctxt,int part_index,exr_attr_v2f_t *swc)

{
  long lVar1;
  int iVar2;
  undefined4 *in_RDX;
  int in_ESI;
  char *in_RDI;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  exr_priv_part_t part;
  exr_context_t in_stack_00000018;
  exr_result_t rv;
  exr_attribute_t *attr;
  undefined4 in_stack_00000030;
  exr_const_context_t_conflict in_stack_ffffffffffffffc0;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = 0;
  if (in_RDI == (char *)0x0) {
    local_2c = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffc0);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffffc0);
      local_2c = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
        local_2c = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
        local_2c = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else {
        if (*(long *)(lVar1 + 0x50) == 0) {
          local_2c = exr_attr_list_add(in_stack_00000018,(exr_attribute_list_t *)part,
                                       in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                                       (uint8_t **)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,(exr_attribute_t **)CONCAT44(part_index,in_stack_00000030));
        }
        else if (*(int *)(*(long *)(lVar1 + 0x50) + 0x14) != 0x18) {
          internal_exr_unlock(in_stack_ffffffffffffffc0);
          iVar2 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(*(long *)(lVar1 + 0x50) + 8),"screenWindowCenter");
          return iVar2;
        }
        lVar1 = *(long *)(lVar1 + 0x50);
        if (local_2c == 0) {
          if (in_RDX == (undefined4 *)0x0) {
            internal_exr_unlock(in_stack_ffffffffffffffc0);
            local_2c = (**(code **)(in_RDI + 0x40))
                                 (in_RDI,3,"Missing value for data window assignment");
          }
          else {
            **(undefined4 **)(lVar1 + 0x18) = *in_RDX;
            *(undefined4 *)(*(long *)(lVar1 + 0x18) + 4) = in_RDX[1];
            internal_exr_unlock(in_stack_ffffffffffffffc0);
          }
        }
        else {
          internal_exr_unlock(in_stack_ffffffffffffffc0);
        }
      }
    }
  }
  return local_2c;
}

Assistant:

exr_result_t
exr_set_screen_window_center (
    exr_context_t ctxt, int part_index, const exr_attr_v2f_t* swc)
{
    REQ_ATTR_FIND_CREATE (screenWindowCenter, EXR_ATTR_V2F);
    if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN (rv);
    if (!swc)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing value for data window assignment"));

    attr->v2f->x = swc->x;
    attr->v2f->y = swc->y;
    return EXR_UNLOCK_AND_RETURN (rv);
}